

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.c
# Opt level: O1

int read_metadata_buff(WavpackContext *wpc,WavpackMetadata *wpmd)

{
  uint uVar1;
  int32_t iVar2;
  int iVar3;
  uchar *puVar4;
  int iVar5;
  long in_FS_OFFSET;
  uchar tchar;
  byte local_31;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  puVar4 = &wpmd->id;
  iVar2 = (*wpc->infile)(puVar4,1);
  iVar5 = 0;
  if ((iVar2 == 0) || (iVar2 = (*wpc->infile)(&local_31,1), iVar2 == 0)) goto LAB_001b0cf4;
  wpmd->byte_length = (uint)local_31 * 2;
  if ((char)wpmd->id < '\0') {
    *puVar4 = wpmd->id & 0x7f;
    iVar2 = (*wpc->infile)(&local_31,1);
    iVar5 = 0;
    if (iVar2 == 0) goto LAB_001b0cf4;
    wpmd->byte_length = wpmd->byte_length + (uint)local_31 * 0x200;
    iVar2 = (*wpc->infile)(&local_31,1);
    if (iVar2 == 0) goto LAB_001b0cf4;
    wpmd->byte_length = wpmd->byte_length + (uint)local_31 * 0x20000;
  }
  if ((*puVar4 & 0x40) != 0) {
    wpmd->id = *puVar4 & 0xbf;
    wpmd->byte_length = wpmd->byte_length + -1;
  }
  uVar1 = wpmd->byte_length;
  if (uVar1 - 1 < 0x400) {
    iVar3 = (uVar1 & 1) + uVar1;
    iVar2 = (*wpc->infile)(wpc->read_buffer,iVar3);
    iVar5 = 0;
    puVar4 = wpc->read_buffer;
    if (iVar2 != iVar3) {
      puVar4 = (uchar *)0x0;
    }
    wpmd->data = puVar4;
    if (iVar2 != iVar3) goto LAB_001b0cf4;
  }
  else {
    wpmd->data = (void *)0x0;
  }
  iVar5 = 1;
LAB_001b0cf4:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return iVar5;
}

Assistant:

int read_metadata_buff (WavpackContext *wpc, WavpackMetadata *wpmd)
{
    uchar tchar;

    if (!wpc->infile (&wpmd->id, 1) || !wpc->infile (&tchar, 1))
        return FALSE;

    wpmd->byte_length = tchar << 1;

    if (wpmd->id & ID_LARGE) {
        wpmd->id &= ~ID_LARGE;

        if (!wpc->infile (&tchar, 1))
            return FALSE;

        wpmd->byte_length += (int32_t) tchar << 9; 

        if (!wpc->infile (&tchar, 1))
            return FALSE;

        wpmd->byte_length += (int32_t) tchar << 17;
    }

    if (wpmd->id & ID_ODD_SIZE) {
        wpmd->id &= ~ID_ODD_SIZE;
        wpmd->byte_length--;
    }

    if (wpmd->byte_length && wpmd->byte_length <= sizeof (wpc->read_buffer)) {
        uint32_t bytes_to_read = wpmd->byte_length + (wpmd->byte_length & 1);

        if (wpc->infile (wpc->read_buffer, bytes_to_read) != (int32_t) bytes_to_read) {
            wpmd->data = NULL;
            return FALSE;
        }

        wpmd->data = wpc->read_buffer;
    }
    else
        wpmd->data = NULL;

    return TRUE;
}